

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O2

size_t jessilib::starts_with_lengthi<char32_t,char>
                 (basic_string_view<char32_t,_std::char_traits<char32_t>_> in_string,
                 basic_string_view<char,_std::char_traits<char>_> in_prefix)

{
  char32_t lhs;
  bool bVar1;
  jessilib *pjVar2;
  size_t sVar3;
  jessilib *extraout_RDX;
  size_t sVar4;
  jessilib *this;
  char *pcVar5;
  decode_result dVar6;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  
  pcVar5 = in_prefix._M_str;
  pjVar2 = (jessilib *)in_prefix._M_len;
  sVar4 = 0;
  this = pjVar2;
  while( true ) {
    if ((in_string._M_len == sVar4) || (this == (jessilib *)0x0)) {
      sVar3 = 0;
      if (this == (jessilib *)0x0) {
        sVar3 = sVar4;
      }
      return sVar3;
    }
    lhs = in_string._M_str[sVar4];
    in_string_00._M_str = (char *)pjVar2;
    in_string_00._M_len = (size_t)pcVar5;
    dVar6 = decode_codepoint_utf8<char>(this,in_string_00);
    sVar3 = dVar6.units;
    if ((sVar3 == 0) || (bVar1 = equalsi(lhs,dVar6.codepoint), !bVar1)) break;
    pcVar5 = pcVar5 + sVar3;
    this = this + -sVar3;
    sVar4 = sVar4 + 1;
    pjVar2 = extraout_RDX;
  }
  return 0;
}

Assistant:

size_t starts_with_lengthi(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, skip decoding each point
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (!equalsi(string_front.codepoint, prefix_front.codepoint)) {
			// Codepoints don't fold to same value
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}